

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::
str<kj::StringPtr&,char_const(&)[3],unsigned_int&,char_const(&)[2],unsigned_int&,char_const(&)[3]>
          (String *__return_storage_ptr__,kj *this,StringPtr *params,char (*params_1) [3],
          uint *params_2,char (*params_3) [2],uint *params_4,char (*params_5) [3])

{
  ArrayPtr<const_char> *in_stack_ffffffffffffff60;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  undefined8 local_58;
  long local_50;
  CappedArray<char,_14UL> local_48;
  
  local_58 = *(undefined8 *)this;
  local_50 = *(long *)(this + 8) + -1;
  local_68 = toCharSequence<char_const(&)[3]>((char (*) [3])params);
  toCharSequence<unsigned_int&>
            ((CappedArray<char,_14UL> *)&stack0xffffffffffffff60,(kj *)params_1,
             (uint *)local_68.size_);
  local_78 = toCharSequence<char_const(&)[2]>((char (*) [2])params_2);
  toCharSequence<unsigned_int&>(&local_48,(kj *)params_3,(uint *)local_78.size_);
  local_88 = toCharSequence<char_const(&)[3]>((char (*) [3])params_4);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_58,&local_68,
             (ArrayPtr<const_char> *)&stack0xffffffffffffff60,(CappedArray<char,_14UL> *)&local_78,
             (ArrayPtr<const_char> *)&local_48,(CappedArray<char,_14UL> *)&local_88,
             in_stack_ffffffffffffff60);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}